

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::~runner
          (runner<ApprovalTests::cfg::reporter,_16> *this)

{
  byte bVar1;
  reporter *in_RDI;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *unaff_retaddr;
  bool should_run;
  runner<ApprovalTests::cfg::reporter,_16> *in_stack_00000018;
  run_cfg in_stack_00000027;
  undefined6 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff6;
  
  bVar1 = ((byte)in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.fail ^ 0xff) & 1
  ;
  if (bVar1 != 0) {
    in_stack_fffffffffffffff6 = 0;
    run(in_stack_00000018,in_stack_00000027);
  }
  if ((in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.field_0x130 & 1) == 0) {
    ApprovalTests::cfg::reporter::on(in_RDI);
  }
  if (((bVar1 & 1) != 0) && (in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.fails_ != 0))
  {
    exit(-1);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(unaff_retaddr);
  filter::~filter((filter *)0x10c337);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::~vector
            ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)unaff_retaddr);
  ApprovalTests::cfg::reporter::~reporter
            ((reporter *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0)));
  return;
}

Assistant:

~runner() {
      const auto should_run = not run_;

      if (should_run) {
        static_cast<void>(run());
      }

      if (not dry_run_) {
        reporter_.on(events::summary{});
      }

      if (should_run and fails_) {
        std::exit(-1);
      }
    }